

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_tls_write_group(mbedtls_ecp_group *grp,size_t *olen,uchar *buf,size_t blen)

{
  mbedtls_ecp_curve_info *pmVar1;
  mbedtls_ecp_curve_info *curve_info;
  size_t blen_local;
  uchar *buf_local;
  size_t *olen_local;
  mbedtls_ecp_group *grp_local;
  
  pmVar1 = mbedtls_ecp_curve_info_from_grp_id(grp->id);
  if (pmVar1 == (mbedtls_ecp_curve_info *)0x0) {
    grp_local._4_4_ = -0x4f80;
  }
  else {
    *olen = 3;
    if (blen < *olen) {
      grp_local._4_4_ = -0x4f00;
    }
    else {
      *buf = '\x03';
      mbedtls_put_unaligned_uint16(buf + 1,pmVar1->tls_id << 8 | pmVar1->tls_id >> 8);
      grp_local._4_4_ = 0;
    }
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecp_tls_write_group(const mbedtls_ecp_group *grp, size_t *olen,
                                unsigned char *buf, size_t blen)
{
    const mbedtls_ecp_curve_info *curve_info;
    if ((curve_info = mbedtls_ecp_curve_info_from_grp_id(grp->id)) == NULL) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    /*
     * We are going to write 3 bytes (see below)
     */
    *olen = 3;
    if (blen < *olen) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    /*
     * First byte is curve_type, always named_curve
     */
    *buf++ = MBEDTLS_ECP_TLS_NAMED_CURVE;

    /*
     * Next two bytes are the namedcurve value
     */
    MBEDTLS_PUT_UINT16_BE(curve_info->tls_id, buf, 0);

    return 0;
}